

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_stream.c
# Opt level: O3

void nghttp2_stream_dep_remove_subtree(nghttp2_stream *stream)

{
  nghttp2_stream *pnVar1;
  nghttp2_stream *pnVar2;
  nghttp2_stream *pnVar3;
  
  pnVar1 = stream->dep_prev;
  if (pnVar1 == (nghttp2_stream *)0x0) {
    __assert_fail("stream->dep_prev",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_stream.c"
                  ,0x38a,"void nghttp2_stream_dep_remove_subtree(nghttp2_stream *)");
  }
  pnVar3 = stream->sib_prev;
  pnVar2 = stream->sib_next;
  if (pnVar3 == (nghttp2_stream *)0x0) {
    pnVar1->dep_next = pnVar2;
    if (pnVar2 == (nghttp2_stream *)0x0) goto LAB_00651e09;
    pnVar2->dep_prev = pnVar1;
    pnVar3 = (nghttp2_stream *)0x0;
  }
  else {
    pnVar3->sib_next = pnVar2;
    if (pnVar2 == (nghttp2_stream *)0x0) goto LAB_00651e09;
  }
  pnVar2->sib_prev = pnVar3;
LAB_00651e09:
  pnVar1->sum_dep_weight = pnVar1->sum_dep_weight - stream->weight;
  if (stream->queued != '\0') {
    stream_obq_remove(stream);
  }
  stream->dep_prev = (nghttp2_stream *)0x0;
  stream->sib_prev = (nghttp2_stream *)0x0;
  stream->sib_next = (nghttp2_stream *)0x0;
  return;
}

Assistant:

void nghttp2_stream_dep_remove_subtree(nghttp2_stream *stream) {
  nghttp2_stream *next, *dep_prev;

  DEBUGF("stream: dep_remove_subtree stream(%p)=%d\n", stream,
         stream->stream_id);

  assert(stream->dep_prev);

  dep_prev = stream->dep_prev;

  if (stream->sib_prev) {
    link_sib(stream->sib_prev, stream->sib_next);
  } else {
    next = stream->sib_next;

    link_dep(dep_prev, next);

    if (next) {
      next->sib_prev = NULL;
    }
  }

  dep_prev->sum_dep_weight -= stream->weight;

  if (stream->queued) {
    stream_obq_remove(stream);
  }

  validate_tree(dep_prev);

  stream->sib_prev = NULL;
  stream->sib_next = NULL;
  stream->dep_prev = NULL;
}